

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O0

int zddTreeSiftingAux(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  int iVar1;
  MtrNode *pMStack_30;
  int res;
  MtrNode *auxnode;
  Cudd_ReorderingType method_local;
  MtrNode *treenode_local;
  DdManager *table_local;
  
  pMStack_30 = treenode;
  do {
    if (pMStack_30 == (MtrNode *)0x0) {
      return 1;
    }
    if (pMStack_30->child == (MtrNode *)0x0) {
      if ((1 < pMStack_30->size) &&
         (iVar1 = zddReorderChildren(table,pMStack_30,method), iVar1 == 0)) {
        return 0;
      }
    }
    else {
      iVar1 = zddTreeSiftingAux(table,pMStack_30->child,method);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = zddReorderChildren(table,pMStack_30,CUDD_REORDER_GROUP_SIFT);
      if (iVar1 == 0) {
        return 0;
      }
    }
    pMStack_30 = pMStack_30->younger;
  } while( true );
}

Assistant:

static int
zddTreeSiftingAux(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    MtrNode  *auxnode;
    int res;

#ifdef DD_DEBUG
    Mtr_PrintGroups(treenode,1);
#endif

    auxnode = treenode;
    while (auxnode != NULL) {
        if (auxnode->child != NULL) {
            if (!zddTreeSiftingAux(table, auxnode->child, method))
                return(0);
            res = zddReorderChildren(table, auxnode, CUDD_REORDER_GROUP_SIFT);
            if (res == 0)
                return(0);
        } else if (auxnode->size > 1) {
            if (!zddReorderChildren(table, auxnode, method))
                return(0);
        }
        auxnode = auxnode->younger;
    }

    return(1);

}